

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::isFormatSupportedForTextureBuffer(TextureFormat *format)

{
  bool local_22;
  bool local_21;
  TextureFormat *format_local;
  
  switch(format->order) {
  case R:
  case RG:
  case RGBA:
    local_22 = true;
    if (((((format->type != UNORM_INT8) && (local_22 = true, format->type != HALF_FLOAT)) &&
         (local_22 = true, format->type != FLOAT)) &&
        ((local_22 = true, format->type != SIGNED_INT8 &&
         (local_22 = true, format->type != SIGNED_INT16)))) &&
       ((local_22 = true, format->type != SIGNED_INT32 &&
        ((local_22 = true, format->type != UNSIGNED_INT8 &&
         (local_22 = true, format->type != UNSIGNED_INT16)))))) {
      local_22 = format->type == UNSIGNED_INT32;
    }
    format_local._7_1_ = local_22;
    break;
  default:
    format_local._7_1_ = false;
    break;
  case RGB:
    local_21 = true;
    if ((format->type != FLOAT) && (local_21 = true, format->type != SIGNED_INT32)) {
      local_21 = format->type == UNSIGNED_INT32;
    }
    format_local._7_1_ = local_21;
  }
  return format_local._7_1_;
}

Assistant:

static inline bool isFormatSupportedForTextureBuffer (const TextureFormat& format)
{
	switch (format.order)
	{
		case TextureFormat::RGB:
			return format.type == TextureFormat::FLOAT				||
				   format.type == TextureFormat::SIGNED_INT32		||
				   format.type == TextureFormat::UNSIGNED_INT32;

		// \note Fallthroughs.
		case TextureFormat::R:
		case TextureFormat::RG:
		case TextureFormat::RGBA:
			return format.type == TextureFormat::UNORM_INT8			||
				   format.type == TextureFormat::HALF_FLOAT			||
				   format.type == TextureFormat::FLOAT				||
				   format.type == TextureFormat::SIGNED_INT8		||
				   format.type == TextureFormat::SIGNED_INT16		||
				   format.type == TextureFormat::SIGNED_INT32		||
				   format.type == TextureFormat::UNSIGNED_INT8		||
				   format.type == TextureFormat::UNSIGNED_INT16		||
				   format.type == TextureFormat::UNSIGNED_INT32;

		default:
			return false;
	}
}